

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O0

int __thiscall de::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  SocketError *this_00;
  Socket *this_01;
  undefined4 in_register_00000034;
  allocator<char> local_41;
  string local_40;
  deSocket *local_20;
  deSocket *clientSocket;
  deSocketAddress *clientAddress_local;
  Socket *this_local;
  
  clientSocket = (deSocket *)CONCAT44(in_register_00000034,__fd);
  clientAddress_local = (deSocketAddress *)this;
  local_20 = deSocket_accept(this->m_socket,(deSocketAddress *)clientSocket);
  if (local_20 == (deSocket *)0x0) {
    this_00 = (SocketError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Accepting connection to socket failed",&local_41);
    SocketError::SocketError(this_00,&local_40);
    __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
  }
  this_01 = (Socket *)operator_new(8);
  Socket(this_01,local_20);
  return (int)this_01;
}

Assistant:

Socket* Socket::accept (deSocketAddress* clientAddress)
{
	deSocket* clientSocket = deSocket_accept(m_socket, clientAddress);
	if (!clientSocket)
		throw SocketError("Accepting connection to socket failed");

	try
	{
		return new Socket(clientSocket);
	}
	catch (...)
	{
		deSocket_destroy(clientSocket);
		throw;
	}
}